

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qshortcut_widgets.cpp
# Opt level: O0

bool correctWidgetContext(ShortcutContext context,QWidget *w,QWidget *active_window)

{
  bool bVar1;
  WindowType WVar2;
  QMenuBar *pQVar3;
  QPlatformMenuBar *pQVar4;
  QWidget *pQVar5;
  QWidgetWindow *pQVar6;
  pointer pQVar7;
  QWidget *pQVar8;
  QWidget *in_RDX;
  QWidget *in_RSI;
  int in_EDI;
  QWidget *focus_widget;
  QWidget *sw;
  bool res;
  pointer topData;
  QWidget *tlw;
  QWidget *tw;
  QWidgetWindow *ww;
  QPlatformMenuBar *pmb;
  QMenuBar *menuBar;
  bool visible;
  byte local_73;
  QWidget *in_stack_ffffffffffffff90;
  QWidget *in_stack_ffffffffffffff98;
  QWidget *in_stack_ffffffffffffffa0;
  QWidget *local_40;
  bool local_19;
  QWidget *local_18;
  QWidget *local_10;
  bool local_1;
  
  if (in_RDX == (QWidget *)0x0) {
    local_1 = false;
  }
  else {
    local_19 = QWidget::isVisible((QWidget *)0x4bf4ae);
    pQVar3 = qobject_cast<QMenuBar*>((QObject *)0x4bf4be);
    local_10 = in_RSI;
    if ((pQVar3 != (QMenuBar *)0x0) &&
       (pQVar4 = QMenuBar::platformMenuBar((QMenuBar *)in_stack_ffffffffffffff90),
       pQVar4 != (QPlatformMenuBar *)0x0)) {
      pQVar5 = QWidget::parentWidget((QWidget *)0x4bf4ec);
      if (pQVar5 == (QWidget *)0x0) {
        (**(code **)(*(long *)pQVar4 + 0x80))();
        pQVar6 = qobject_cast<QWidgetWindow*>((QObject *)0x4bf50f);
        if (pQVar6 == (QWidgetWindow *)0x0) {
          return false;
        }
        local_10 = QWidgetWindow::widget((QWidgetWindow *)0x4bf526);
      }
      else {
        local_19 = true;
      }
    }
    if ((local_19 == false) || (bVar1 = QWidget::isEnabled((QWidget *)0x4bf54e), !bVar1)) {
      local_1 = false;
    }
    else if (in_EDI == 2) {
      local_1 = QApplicationPrivate::tryModalHelper
                          (in_stack_ffffffffffffff98,(QWidget **)in_stack_ffffffffffffff90);
    }
    else if (in_EDI == 0) {
      pQVar5 = QApplication::focusWidget();
      local_1 = local_10 == pQVar5;
    }
    else if (in_EDI == 3) {
      local_40 = QApplication::focusWidget();
      while( true ) {
        bVar1 = false;
        if ((local_40 != (QWidget *)0x0) && (bVar1 = false, local_40 != local_10)) {
          WVar2 = QWidget::windowType(in_stack_ffffffffffffff90);
          bVar1 = true;
          if (WVar2 != Widget) {
            WVar2 = QWidget::windowType(in_stack_ffffffffffffff90);
            bVar1 = true;
            if (WVar2 != Popup) {
              WVar2 = QWidget::windowType(in_stack_ffffffffffffff90);
              bVar1 = WVar2 == SubWindow;
            }
          }
        }
        if (!bVar1) break;
        local_40 = QWidget::parentWidget((QWidget *)0x4bf63e);
      }
      local_1 = local_40 == local_10;
    }
    else {
      pQVar5 = QWidget::window(in_stack_ffffffffffffffa0);
      QObjectPrivate::get((QObject *)0x4bf679);
      pQVar7 = std::unique_ptr<QWExtra,_std::default_delete<QWExtra>_>::get
                         ((unique_ptr<QWExtra,_std::default_delete<QWExtra>_> *)0x4bf685);
      if ((pQVar7 == (pointer)0x0) || (pQVar7->proxyWidget == (QGraphicsProxyWidget *)0x0)) {
        local_18 = in_RDX;
        if ((in_RDX != (QWidget *)0x0) && (in_RDX != pQVar5)) {
          WVar2 = QWidget::windowType(in_stack_ffffffffffffff90);
          if ((WVar2 == Tool) &&
             (pQVar8 = QWidget::parentWidget((QWidget *)0x4bf6f9), pQVar8 != (QWidget *)0x0)) {
            QWidget::parentWidget((QWidget *)0x4bf709);
            local_18 = QWidget::window(in_stack_ffffffffffffffa0);
          }
          else {
            WVar2 = QWidget::windowType(in_stack_ffffffffffffff90);
            if ((WVar2 == Popup) &&
               (pQVar8 = QWidget::focusProxy(in_stack_ffffffffffffff90), pQVar8 != (QWidget *)0x0))
            {
              QWidget::focusProxy(in_stack_ffffffffffffff90);
              local_18 = QWidget::window(in_stack_ffffffffffffffa0);
            }
          }
        }
        if ((local_18 == pQVar5) ||
           (pQVar3 = qobject_cast<QMenuBar*>((QObject *)0x4bf768), pQVar3 != (QMenuBar *)0x0)) {
          while( true ) {
            local_73 = 0;
            if (local_10 != (QWidget *)0x0) {
              WVar2 = QWidget::windowType(in_stack_ffffffffffffff90);
              local_73 = 0;
              if (WVar2 != SubWindow) {
                bVar1 = QWidget::isWindow(in_stack_ffffffffffffff90);
                local_73 = bVar1 ^ 0xff;
              }
            }
            if ((local_73 & 1) == 0) break;
            local_10 = QWidget::parentWidget((QWidget *)0x4bf7cd);
          }
          if ((local_10 == (QWidget *)0x0) ||
             (WVar2 = QWidget::windowType(in_stack_ffffffffffffff90), WVar2 != SubWindow)) {
            local_1 = QApplicationPrivate::tryModalHelper
                                (in_stack_ffffffffffffff98,(QWidget **)in_stack_ffffffffffffff90);
          }
          else {
            pQVar5 = QApplication::focusWidget();
            while (pQVar5 != (QWidget *)0x0 && pQVar5 != local_10) {
              pQVar5 = QWidget::parentWidget((QWidget *)0x4bf828);
            }
            local_1 = local_10 == pQVar5;
          }
        }
        else {
          local_1 = false;
        }
      }
      else {
        local_1 = correctGraphicsWidgetContext
                            ((ShortcutContext)tw,(QGraphicsWidget *)tlw,(QWidget *)topData);
      }
    }
  }
  return local_1;
}

Assistant:

static bool correctWidgetContext(Qt::ShortcutContext context, QWidget *w, QWidget *active_window)
{
    if (!active_window)
        return false;

    bool visible = w->isVisible();
#if QT_CONFIG(menubar)
    if (auto menuBar = qobject_cast<QMenuBar *>(w)) {
        if (auto *pmb = menuBar->platformMenuBar()) {
            if (menuBar->parentWidget()) {
                visible = true;
            } else {
                if (auto *ww = qobject_cast<QWidgetWindow *>(pmb->parentWindow()))
                    w = ww->widget(); // Good enough since we only care about the window
                else
                    return false; // This is not a QWidget window. We won't deliver
            }
        }
    }
#endif

    if (!visible || !w->isEnabled())
        return false;

    if (context == Qt::ApplicationShortcut)
        return QApplicationPrivate::tryModalHelper(w, nullptr); // true, unless w is shadowed by a modal dialog

    if (context == Qt::WidgetShortcut)
        return w == QApplication::focusWidget();

    if (context == Qt::WidgetWithChildrenShortcut) {
        const QWidget *tw = QApplication::focusWidget();
        while (tw && tw != w && (tw->windowType() == Qt::Widget || tw->windowType() == Qt::Popup || tw->windowType() == Qt::SubWindow))
            tw = tw->parentWidget();
        return tw == w;
    }

    // Below is Qt::WindowShortcut context
    QWidget *tlw = w->window();
#if QT_CONFIG(graphicsview)
    if (auto topData = static_cast<QWidgetPrivate *>(QObjectPrivate::get(tlw))->extra.get()) {
        if (topData->proxyWidget) {
            bool res = correctGraphicsWidgetContext(context, topData->proxyWidget, active_window);
            return res;
        }
    }
#endif

    if (active_window && active_window != tlw) {
        /* if a floating tool window is active, keep shortcuts on the parent working.
         * and if a popup window is active (f.ex a completer), keep shortcuts on the
         * focus proxy working */
        if (active_window->windowType() == Qt::Tool && active_window->parentWidget()) {
            active_window = active_window->parentWidget()->window();
        } else if (active_window->windowType() == Qt::Popup && active_window->focusProxy()) {
            active_window = active_window->focusProxy()->window();
        }
    }

    if (active_window != tlw) {
#if QT_CONFIG(menubar)
        // If the tlw is a QMenuBar then we allow it to proceed as this indicates that
        // the QMenuBar is a parentless one and is therefore used for multiple top level
        // windows in the application. This is common on macOS platforms for example.
        if (!qobject_cast<QMenuBar *>(tlw))
#endif
        return false;
    }

    /* if we live in a MDI subwindow, ignore the event if we are
       not the active document window */
    const QWidget* sw = w;
    while (sw && !(sw->windowType() == Qt::SubWindow) && !sw->isWindow())
        sw = sw->parentWidget();
    if (sw && (sw->windowType() == Qt::SubWindow)) {
        QWidget *focus_widget = QApplication::focusWidget();
        while (focus_widget && focus_widget != sw)
            focus_widget = focus_widget->parentWidget();
        return sw == focus_widget;
    }

#if defined(DEBUG_QSHORTCUTMAP)
    qDebug().nospace() << "..true [Pass-through]";
#endif
    return QApplicationPrivate::tryModalHelper(w, nullptr);
}